

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O3

void __thiscall
SimpleBVH::BVH::get_nearest_facet_hint
          (BVH *this,VectorMax3d *p,int *nearest_f,VectorMax3d *nearest_point,double *sq_dist)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  double dVar8;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
  local_c0;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
  local_a0;
  double local_78;
  ulong local_70;
  plainobjectbase_evaluator_data<double,_0> local_68;
  int *local_60;
  double *local_58;
  plainobjectbase_evaluator_data<double,_0> local_50;
  BVH *local_48;
  int local_3c;
  int local_38;
  scalar_sum_op<double,_double> local_31;
  
  iVar3 = (int)this->n_corners;
  iVar4 = 0;
  local_68.data = (double *)nearest_point;
  local_60 = nearest_f;
  local_58 = sq_dist;
  local_50.data = (double *)p;
  local_48 = this;
  if (iVar3 != 1) {
    uVar7 = 1;
    iVar4 = 0;
    do {
      iVar5 = (iVar3 - iVar4) / 2 + iVar4;
      uVar2 = (int)uVar7 * 2;
      uVar6 = (int)uVar7 * 2 + 1;
      local_3c = iVar3;
      local_38 = iVar4;
      local_78 = anon_unknown_6::point_box_center_squared_distance
                           (p,(this->boxlist).
                              super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + (int)uVar2);
      local_70 = (ulong)uVar6;
      dVar8 = anon_unknown_6::point_box_center_squared_distance
                        (p,(this->boxlist).
                           super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + (int)uVar6);
      uVar7 = local_70;
      iVar3 = local_3c;
      iVar4 = iVar5;
      if (local_78 < dVar8) {
        uVar7 = (ulong)uVar2;
        iVar3 = iVar5;
        iVar4 = local_38;
      }
    } while (iVar3 != iVar4 + 1);
  }
  *local_60 = iVar4;
  point_callback((VectorMax3d *)&local_a0,local_48,
                 (local_48->new2old).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar4]);
  local_a0.m_xpr.m_rhs = (RhsNested)local_68.data;
  if ((&local_a0 !=
       (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
        *)local_68.data) &&
     (local_68.data[3] = (double)local_a0.m_xpr._16_8_, local_a0.m_xpr._16_8_ != 0)) {
    memcpy(local_68.data,&local_a0,local_a0.m_xpr._16_8_ << 3);
  }
  lVar1 = (long)local_50.data[3];
  if (lVar1 != *(Index *)((long)local_a0.m_xpr.m_rhs + 0x18)) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/CwiseBinaryOp.h"
                  ,0x74,
                  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1, 0, 3, 1>, Rhs = const Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
                 );
  }
  local_a0.m_xpr.m_lhs = (LhsNested)local_50.data;
  if (lVar1 == 0) {
    dVar8 = 0.0;
  }
  else {
    if (lVar1 < 1) {
      __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                    "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/Redux.h"
                    ,0x19b,
                    "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                   );
    }
    local_c0.
    super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>,_Eigen::internal::IndexBased,_double>
    .m_d.argImpl.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>.m_d.data =
         (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)
         (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)local_50.data;
    local_c0.
    super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>,_Eigen::internal::IndexBased,_double>
    .m_d.argImpl.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>.m_d.data =
         (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)
         (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)local_a0.m_xpr.m_rhs;
    dVar8 = Eigen::internal::
            redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>const>>,3,0>
            ::
            run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>const>>
                      (&local_c0,&local_31,&local_a0);
  }
  *local_58 = dVar8;
  return;
}

Assistant:

void BVH::get_nearest_facet_hint(
    const VectorMax3d& p,
    int& nearest_f,
    VectorMax3d& nearest_point,
    double& sq_dist) const
{
    int b = 0;
    int e = n_corners;
    int n = 1;
    while (e != b + 1) {
        int m = b + (e - b) / 2;
        int childl = 2 * n;
        int childr = 2 * n + 1;
        if (point_box_center_squared_distance(p, boxlist[childl])
            < point_box_center_squared_distance(p, boxlist[childr])) {
            e = m;
            n = childl;
        } else {
            b = m;
            n = childr;
        }
    }
    nearest_f = b;

    nearest_point = point_callback(new2old[nearest_f]);
    sq_dist = (p - nearest_point).squaredNorm();
}